

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O1

Float __thiscall
pbrt::LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::PDF
          (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *this,Vector3f wo,
          Vector3f wi,TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  undefined4 in_register_00000034;
  ulong uVar13;
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *this_00;
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *this_01;
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *pLVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  undefined8 in_XMM0_Qb;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  Float uc;
  undefined8 in_XMM2_Qb;
  undefined1 auVar27 [64];
  float fVar28;
  uint in_XMM3_Db;
  uint in_XMM3_Dd;
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined4 in_XMM6_Da;
  undefined1 in_register_00001384 [12];
  Vector3f wo_00;
  Vector3f wo_01;
  Vector3f wo_02;
  Vector3f wo_03;
  Vector3f wo_04;
  Vector3f wo_05;
  Vector3f wo_06;
  Vector3f wo_07;
  Vector3f wo_08;
  Vector3f wo_09;
  Vector3f wo_10;
  Vector3f wo_11;
  Vector3f wo_12;
  Vector3f wo_13;
  Vector3f wo_14;
  Vector3f wo_15;
  Vector3f wo_16;
  Vector3f wo_17;
  Vector3f wi_00;
  Vector3f wi_01;
  Vector3f wi_02;
  Vector3f wi_03;
  Vector3f wi_04;
  Vector3f wi_05;
  Vector3f wi_06;
  Vector3f wi_07;
  Vector3f wi_08;
  Vector3f wi_09;
  BSDFSample wis;
  BSDFSample wos;
  float local_fc;
  Tuple2<pbrt::Point2,_float> local_f8;
  TransportMode local_ec;
  float local_e8;
  float fStack_e4;
  uint uStack_e0;
  uint uStack_dc;
  float local_d8;
  float fStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *local_c8;
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *local_c0;
  undefined1 local_b8 [16];
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *local_a8;
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *local_a0;
  Float local_98;
  float local_94;
  BSDFSample local_90;
  BSDFSample local_6c;
  float local_48;
  uint uStack_44;
  undefined4 uStack_40;
  uint uStack_3c;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  uStack_40 = 0;
  local_48 = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar22._4_60_ = wo._12_60_;
  auVar22._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  local_e8 = wi.super_Tuple3<pbrt::Vector3,_float>.x;
  fStack_e4 = wi.super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_e0 = (uint)in_XMM2_Qb;
  uStack_dc = (uint)((ulong)in_XMM2_Qb >> 0x20);
  local_d8 = wo.super_Tuple3<pbrt::Vector3,_float>.x;
  fStack_d4 = wo.super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_d0 = (uint)in_XMM0_Qb;
  uStack_cc = (uint)((ulong)in_XMM0_Qb >> 0x20);
  if (sampleFlags != All) {
    LogFatal<char_const(&)[39]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bxdfs.h"
               ,0x41e,"Check failed: %s",(char (*) [39])"sampleFlags == BxDFReflTransFlags::All");
  }
  auVar30 = ZEXT1664(auVar22._0_16_);
  if (((this->config).twoSided != '\0') && (auVar22._0_4_ < 0.0)) {
    local_d8 = -local_d8;
    fStack_d4 = -fStack_d4;
    uStack_d0 = uStack_d0 ^ 0x80000000;
    uStack_cc = uStack_cc ^ 0x80000000;
    auVar30 = ZEXT1664(CONCAT412(wo._20_4_ ^ 0x80000000,
                                 CONCAT48(wo._16_4_ ^ 0x80000000,
                                          CONCAT44(wo._12_4_,auVar22._0_4_) ^ 0x8000000080000000)));
    local_e8 = -local_e8;
    fStack_e4 = -fStack_e4;
    uStack_e0 = uStack_e0 ^ 0x80000000;
    uStack_dc = uStack_dc ^ 0x80000000;
    local_48 = -local_48;
    in_XMM3_Db = in_XMM3_Db ^ 0x80000000;
    uStack_40 = 0x80000000;
    in_XMM3_Dd = in_XMM3_Dd ^ 0x80000000;
  }
  uVar12 = *(uint *)(Options + 4);
  fVar17 = auVar30._0_4_;
  local_94 = local_48 * fVar17;
  local_fc = 0.0;
  local_b8 = auVar30._0_16_;
  uStack_44 = in_XMM3_Db;
  uStack_3c = in_XMM3_Dd;
  if (0.0 < local_94) {
    bVar9 = (this->config).nSamples;
    if (fVar17 <= 0.0) {
      wo_01.super_Tuple3<pbrt::Vector3,_float>.y = fStack_d4;
      wo_01.super_Tuple3<pbrt::Vector3,_float>.x = local_d8;
      wi_01.super_Tuple3<pbrt::Vector3,_float>.y = fStack_e4;
      wi_01.super_Tuple3<pbrt::Vector3,_float>.x = local_e8;
      in_register_00000034 = 0;
      wo_01.super_Tuple3<pbrt::Vector3,_float>.z = fVar17;
      wi_01.super_Tuple3<pbrt::Vector3,_float>.z = local_48;
      auVar30._0_4_ = ConductorBxDF::PDF(&this->bottom,wo_01,wi_01,mode,Reflection);
      auVar30._4_60_ = extraout_var_00;
      auVar16 = auVar30._0_16_;
    }
    else {
      wo_00.super_Tuple3<pbrt::Vector3,_float>.y = fStack_d4;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.x = local_d8;
      wi_00.super_Tuple3<pbrt::Vector3,_float>.y = fStack_e4;
      wi_00.super_Tuple3<pbrt::Vector3,_float>.x = local_e8;
      in_register_00000034 = 0;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar17;
      wi_00.super_Tuple3<pbrt::Vector3,_float>.z = local_48;
      auVar27._0_4_ = DielectricInterfaceBxDF::PDF(&this->top,wo_00,wi_00,mode,Reflection);
      auVar27._4_60_ = extraout_var;
      auVar16 = auVar27._0_16_;
    }
    auVar30 = ZEXT1664(local_b8);
    auVar16 = vfmadd213ss_fma(auVar16,ZEXT416((uint)(float)bVar9),ZEXT416(0));
    local_fc = auVar16._0_4_;
  }
  bVar9 = (this->config).nSamples;
  if (bVar9 != 0) {
    uVar11 = CONCAT44(fStack_d4,local_d8) * -0x395b586ca42e166b;
    fVar17 = auVar30._0_4_;
    uVar11 = (CONCAT44(in_register_00000034,fVar17) ^
             ((uVar11 >> 0x2f ^ uVar11) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) *
             -0x395b586ca42e166b) * -0x395b586ca42e166b;
    uVar13 = CONCAT44(fStack_e4,local_e8) * -0x395b586ca42e166b;
    uVar11 = (uVar11 >> 0x2f ^ uVar11) * -0x395b586ca42e166b;
    uVar11 = (uVar12 & 0xffffff ^ uVar11 ^ 0x1a929e4d6f47a654 ^
             (uVar11 >> 0x2f | (ulong)(uVar12 & 0xff000000))) * -0x395b586ca42e166b;
    uVar13 = (CONCAT44(0x4fb7dae8,local_48) ^
             ((uVar13 >> 0x2f ^ uVar13) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) *
             -0x395b586ca42e166b) * -0x395b586ca42e166b;
    uVar11 = (uVar11 >> 0x2f ^ uVar11) * -0x395b586ca42e166b;
    uVar13 = (uVar13 >> 0x2f ^ uVar13) * -0x395b586ca42e166b;
    uVar11 = uVar11 >> 0x2f ^ uVar11;
    lVar1 = uVar11 * 2 + 1;
    uVar11 = ((uVar13 >> 0x2f ^ uVar13) + 1) * 0x5851f42d4c957f2d + uVar11 * -0x4f5c17a566d501a4 + 1
    ;
    local_ec = (TransportMode)(mode == Radiance);
    pLVar14 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0;
    local_a0 = this;
    if (0.0 < fVar17) {
      local_a0 = pLVar14;
    }
    local_c0 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)&this->bottom;
    local_a8 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0;
    if (0.0 < fVar17) {
      local_c0 = pLVar14;
      local_a8 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)&this->bottom;
    }
    local_c8 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0;
    if (0.0 < fVar17) {
      local_c8 = this;
    }
    do {
      uVar12 = (uint)(uVar11 >> 0x2d) ^ (uint)(uVar11 >> 0x1b);
      bVar9 = (byte)(uVar11 >> 0x3b);
      uVar13 = uVar11 * 0x5851f42d4c957f2d + lVar1;
      uVar10 = uVar13 * 0x5851f42d4c957f2d + lVar1;
      uVar11 = uVar10 * 0x5851f42d4c957f2d + lVar1;
      auVar16._4_12_ = in_register_00001384;
      auVar16._0_4_ = in_XMM6_Da;
      auVar16 = vcvtusi2ss_avx512f(auVar16,uVar12 >> bVar9 | uVar12 << 0x20 - bVar9);
      auVar16 = vminss_avx(ZEXT416((uint)(auVar16._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar13;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar10;
      auVar19 = vpunpcklqdq_avx(auVar18,auVar23);
      auVar15 = vpsrlvq_avx2(auVar19,_DAT_005c85b0);
      auVar18 = vpsrlvq_avx2(auVar19,_DAT_005c85c0);
      auVar15 = vpshufd_avx(auVar15 ^ auVar18,0xe8);
      auVar19 = vpsrlq_avx(auVar19,0x3b);
      auVar19 = vpshufd_avx(auVar19,0xe8);
      auVar15 = vprorvd_avx512vl(auVar15,auVar19);
      auVar19 = vcvtudq2ps_avx512vl(auVar15);
      auVar15._8_4_ = 0x2f800000;
      auVar15._0_8_ = 0x2f8000002f800000;
      auVar15._12_4_ = 0x2f800000;
      auVar15 = vmulps_avx512vl(auVar19,auVar15);
      auVar19._8_4_ = 0x3f7fffff;
      auVar19._0_8_ = 0x3f7fffff3f7fffff;
      auVar19._12_4_ = 0x3f7fffff;
      auVar15 = vminps_avx512vl(auVar15,auVar19);
      fVar17 = auVar30._0_4_;
      uc = auVar16._0_4_;
      bVar9 = (byte)(uVar11 >> 0x38);
      uVar12 = (uint)(uVar11 >> 0x20);
      if (local_94 <= 0.0) {
        local_f8 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar15);
        if (fVar17 <= 0.0) {
          wo_07.super_Tuple3<pbrt::Vector3,_float>.y = fStack_d4;
          wo_07.super_Tuple3<pbrt::Vector3,_float>.x = local_d8;
          wo_07.super_Tuple3<pbrt::Vector3,_float>.z = fVar17;
          ConductorBxDF::Sample_f
                    (&local_6c,(ConductorBxDF *)local_c0,wo_07,uc,(Point2f *)&local_f8,mode,All);
        }
        else {
          wo_03.super_Tuple3<pbrt::Vector3,_float>.y = fStack_d4;
          wo_03.super_Tuple3<pbrt::Vector3,_float>.x = local_d8;
          wo_03.super_Tuple3<pbrt::Vector3,_float>.z = fVar17;
          DielectricInterfaceBxDF::Sample_f
                    (&local_6c,&local_c8->top,wo_03,uc,(Point2f *)&local_f8,mode,All);
        }
        if (local_6c.pdf <= 0.0) {
          auVar30 = ZEXT1664(local_b8);
        }
        else {
          auVar30 = ZEXT1664(local_b8);
          if (((local_6c.wi.super_Tuple3<pbrt::Vector3,_float>.z != 0.0) ||
              (NAN(local_6c.wi.super_Tuple3<pbrt::Vector3,_float>.z))) &&
             (((undefined1)local_6c.flags & Reflection) == Unset)) {
            uVar12 = uVar12 >> 0xd ^ (uint)(uVar11 >> 0x1b);
            bVar9 = bVar9 >> 3;
            uVar11 = uVar11 * 0x5851f42d4c957f2d + lVar1;
            uVar13 = uVar11 * 0x5851f42d4c957f2d + lVar1;
            auVar8._4_12_ = in_register_00001384;
            auVar8._0_4_ = in_XMM6_Da;
            auVar16 = vcvtusi2ss_avx512f(auVar8,uVar12 >> bVar9 | uVar12 << 0x20 - bVar9);
            auVar16 = vminss_avx(ZEXT416((uint)(auVar16._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff))
            ;
            auVar21._8_8_ = 0;
            auVar21._0_8_ = uVar11;
            auVar29._8_8_ = 0;
            auVar29._0_8_ = uVar13;
            auVar19 = vpunpcklqdq_avx(auVar21,auVar29);
            auVar15 = vpsrlvq_avx2(auVar19,_DAT_005c85b0);
            auVar18 = vpsrlvq_avx2(auVar19,_DAT_005c85c0);
            auVar15 = vpshufd_avx(auVar15 ^ auVar18,0xe8);
            auVar19 = vpsrlq_avx(auVar19,0x3b);
            auVar19 = vpshufd_avx(auVar19,0xe8);
            auVar15 = vprorvd_avx512vl(auVar15,auVar19);
            auVar15 = vcvtudq2ps_avx512vl(auVar15);
            auVar4._8_4_ = 0x2f800000;
            auVar4._0_8_ = 0x2f8000002f800000;
            auVar4._12_4_ = 0x2f800000;
            auVar15 = vmulps_avx512vl(auVar15,auVar4);
            auVar5._8_4_ = 0x3f7fffff;
            auVar5._0_8_ = 0x3f7fffff3f7fffff;
            auVar5._12_4_ = 0x3f7fffff;
            auVar15 = vminps_avx512vl(auVar15,auVar5);
            local_f8 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar15);
            if (local_b8._0_4_ <= 0.0) {
              wo_11.super_Tuple3<pbrt::Vector3,_float>.y = fStack_e4;
              wo_11.super_Tuple3<pbrt::Vector3,_float>.x = local_e8;
              wo_11.super_Tuple3<pbrt::Vector3,_float>.z = local_48;
              DielectricInterfaceBxDF::Sample_f
                        (&local_90,&local_a0->top,wo_11,auVar16._0_4_,(Point2f *)&local_f8,local_ec,
                         All);
            }
            else {
              wo_08.super_Tuple3<pbrt::Vector3,_float>.y = fStack_e4;
              wo_08.super_Tuple3<pbrt::Vector3,_float>.x = local_e8;
              wo_08.super_Tuple3<pbrt::Vector3,_float>.z = local_48;
              ConductorBxDF::Sample_f
                        (&local_90,(ConductorBxDF *)local_a8,wo_08,auVar16._0_4_,
                         (Point2f *)&local_f8,local_ec,All);
            }
            auVar30 = ZEXT1664(local_b8);
            if (((local_90.pdf <= 0.0) ||
                ((local_90.wi.super_Tuple3<pbrt::Vector3,_float>.z == 0.0 &&
                 (!NAN(local_90.wi.super_Tuple3<pbrt::Vector3,_float>.z))))) ||
               (((undefined1)local_90.flags & Reflection) != Unset)) goto LAB_003461b8;
            fVar17 = local_b8._0_4_;
            if (fVar17 <= 0.0) {
              auVar16 = vminss_avx(ZEXT416((uint)(local_c0->top).mfDistrib.alpha_x),
                                   ZEXT416((uint)(local_c0->top).eta));
              bVar9 = (auVar16._0_4_ < 0.001) * '\b' + 9;
            }
            else {
              auVar16 = vminss_avx(ZEXT416((uint)(local_c8->top).mfDistrib.alpha_y),
                                   ZEXT416((uint)(local_c8->top).mfDistrib.alpha_x));
              bVar9 = (auVar16._0_4_ < 0.001) * '\b' + 0xb;
            }
            if (bVar9 < 0x10) {
              if (fVar17 <= 0.0) {
                auVar16 = vminss_avx(ZEXT416((uint)(local_a0->top).mfDistrib.alpha_y),
                                     ZEXT416((uint)(local_a0->top).mfDistrib.alpha_x));
                bVar9 = (auVar16._0_4_ < 0.001) * '\b' + 0xb;
              }
              else {
                auVar16 = vminss_avx(ZEXT416((uint)(local_a8->top).mfDistrib.alpha_x),
                                     ZEXT416((uint)(local_a8->top).eta));
                bVar9 = (auVar16._0_4_ < 0.001) * '\b' + 9;
              }
              auVar6._8_4_ = 0x80000000;
              auVar6._0_8_ = 0x8000000080000000;
              auVar6._12_4_ = 0x80000000;
              auVar16 = vxorps_avx512vl(ZEXT416((uint)local_90.wi.super_Tuple3<pbrt::Vector3,_float>
                                                      .x),auVar6);
              if (bVar9 < 0x10) {
                auVar25._0_4_ = -local_90.wi.super_Tuple3<pbrt::Vector3,_float>.y;
                auVar25._4_4_ = 0x80000000;
                auVar25._8_4_ = 0x80000000;
                auVar25._12_4_ = 0x80000000;
                wi_04.super_Tuple3<pbrt::Vector3,_float>.z =
                     -local_90.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                auVar16 = vinsertps_avx(auVar16,auVar25,0x10);
                wi_04.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar16._0_8_;
                if (fVar17 <= 0.0) {
                  wo_14.super_Tuple3<pbrt::Vector3,_float>.y = fStack_d4;
                  wo_14.super_Tuple3<pbrt::Vector3,_float>.x = local_d8;
                  wo_14.super_Tuple3<pbrt::Vector3,_float>.z = fVar17;
                  wi_06.super_Tuple3<pbrt::Vector3,_float>.z =
                       wi_04.super_Tuple3<pbrt::Vector3,_float>.z;
                  wi_06.super_Tuple3<pbrt::Vector3,_float>.x =
                       (float)(int)wi_04.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  wi_06.super_Tuple3<pbrt::Vector3,_float>.y =
                       (float)(int)((ulong)wi_04.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
                  local_98 = ConductorBxDF::PDF((ConductorBxDF *)local_c0,wo_14,wi_06,mode,All);
                }
                else {
                  wo_12.super_Tuple3<pbrt::Vector3,_float>.y = fStack_d4;
                  wo_12.super_Tuple3<pbrt::Vector3,_float>.x = local_d8;
                  wo_12.super_Tuple3<pbrt::Vector3,_float>.z = fVar17;
                  local_98 = DielectricInterfaceBxDF::PDF(&local_c8->top,wo_12,wi_04,mode,All);
                }
                wo_15.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                     local_6c.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                wo_15.super_Tuple3<pbrt::Vector3,_float>.z =
                     -local_6c.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                if ((float)local_b8._0_4_ <= 0.0) {
                  wi_09.super_Tuple3<pbrt::Vector3,_float>.y = fStack_e4;
                  wi_09.super_Tuple3<pbrt::Vector3,_float>.x = local_e8;
                  wo_17.super_Tuple3<pbrt::Vector3,_float>.z =
                       wo_15.super_Tuple3<pbrt::Vector3,_float>.z;
                  wo_17.super_Tuple3<pbrt::Vector3,_float>.x =
                       (float)(int)wo_15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  wo_17.super_Tuple3<pbrt::Vector3,_float>.y =
                       (float)(int)(wo_15.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
                  wi_09.super_Tuple3<pbrt::Vector3,_float>.z = local_48;
                  fVar17 = DielectricInterfaceBxDF::PDF(&local_a0->top,wo_17,wi_09,mode,All);
                }
                else {
                  wi_07.super_Tuple3<pbrt::Vector3,_float>.y = fStack_e4;
                  wi_07.super_Tuple3<pbrt::Vector3,_float>.x = local_e8;
                  wi_07.super_Tuple3<pbrt::Vector3,_float>.z = local_48;
                  fVar17 = ConductorBxDF::PDF((ConductorBxDF *)local_a8,wo_15,wi_07,mode,All);
                }
                fVar17 = (fVar17 + local_98) * 0.5;
              }
              else {
                auVar26._0_4_ = -local_90.wi.super_Tuple3<pbrt::Vector3,_float>.y;
                auVar26._4_4_ = 0x80000000;
                auVar26._8_4_ = 0x80000000;
                auVar26._12_4_ = 0x80000000;
                auVar16 = vinsertps_avx(auVar16,auVar26,0x10);
                auVar27 = ZEXT1664(auVar16);
                fVar28 = -local_90.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                if (0.0 < fVar17) {
                  auVar22 = ZEXT1664(CONCAT412(uStack_cc,
                                               CONCAT48(uStack_d0,CONCAT44(fStack_d4,local_d8))));
                  auVar30 = ZEXT1664(local_b8);
                  this_00 = local_c8;
                  goto LAB_003460d5;
                }
                auVar22 = ZEXT1664(CONCAT412(uStack_cc,
                                             CONCAT48(uStack_d0,CONCAT44(fStack_d4,local_d8))));
                auVar30 = ZEXT1664(local_b8);
                this_01 = local_c0;
LAB_0034616b:
                wo_16.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar22._0_8_;
                wo_16.super_Tuple3<pbrt::Vector3,_float>.z = auVar30._0_4_;
                wi_08.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar27._0_8_;
                wi_08.super_Tuple3<pbrt::Vector3,_float>.z = fVar28;
                fVar17 = ConductorBxDF::PDF((ConductorBxDF *)this_01,wo_16,wi_08,mode,All);
              }
            }
            else {
              auVar22 = ZEXT1664(CONCAT412(0x80000000,
                                           CONCAT48(0x80000000,
                                                    local_6c.wi.super_Tuple3<pbrt::Vector3,_float>.
                                                    _0_8_ ^ 0x8000000080000000)));
              auVar30 = ZEXT1664(CONCAT412(0x80000000,
                                           CONCAT48(0x80000000,
                                                    CONCAT44(0x80000000,
                                                             -local_6c.wi.
                                                              super_Tuple3<pbrt::Vector3,_float>.z))
                                          ));
              fVar28 = local_48;
              if (0.0 < fVar17) {
                auVar27 = ZEXT1664(CONCAT412(uStack_dc,
                                             CONCAT48(uStack_e0,CONCAT44(fStack_e4,local_e8))));
                this_01 = local_a8;
                goto LAB_0034616b;
              }
              auVar27 = ZEXT1664(CONCAT412(uStack_dc,
                                           CONCAT48(uStack_e0,CONCAT44(fStack_e4,local_e8))));
              this_00 = local_a0;
LAB_003460d5:
              wo_13.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar22._0_8_;
              wo_13.super_Tuple3<pbrt::Vector3,_float>.z = auVar30._0_4_;
              wi_05.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar27._0_8_;
              wi_05.super_Tuple3<pbrt::Vector3,_float>.z = fVar28;
              fVar17 = DielectricInterfaceBxDF::PDF(&this_00->top,wo_13,wi_05,mode,All);
            }
            local_fc = local_fc + fVar17;
            auVar30 = ZEXT1664(local_b8);
            goto LAB_003461b8;
          }
        }
      }
      else {
        local_f8 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar15);
        if (fVar17 <= 0.0) {
          wo_04.super_Tuple3<pbrt::Vector3,_float>.y = fStack_d4;
          wo_04.super_Tuple3<pbrt::Vector3,_float>.x = local_d8;
          wo_04.super_Tuple3<pbrt::Vector3,_float>.z = fVar17;
          ConductorBxDF::Sample_f
                    (&local_6c,(ConductorBxDF *)local_c0,wo_04,uc,(Point2f *)&local_f8,mode,All);
        }
        else {
          wo_02.super_Tuple3<pbrt::Vector3,_float>.y = fStack_d4;
          wo_02.super_Tuple3<pbrt::Vector3,_float>.x = local_d8;
          wo_02.super_Tuple3<pbrt::Vector3,_float>.z = fVar17;
          DielectricInterfaceBxDF::Sample_f
                    (&local_6c,&local_c8->top,wo_02,uc,(Point2f *)&local_f8,mode,All);
        }
        if (((local_6c.pdf <= 0.0) ||
            ((local_6c.wi.super_Tuple3<pbrt::Vector3,_float>.z == 0.0 &&
             (!NAN(local_6c.wi.super_Tuple3<pbrt::Vector3,_float>.z))))) ||
           (((undefined1)local_6c.flags & Reflection) != Unset)) {
          if ((float)local_b8._0_4_ <= 0.0) {
            wo_09.super_Tuple3<pbrt::Vector3,_float>.y = fStack_d4;
            wo_09.super_Tuple3<pbrt::Vector3,_float>.x = local_d8;
            wi_03.super_Tuple3<pbrt::Vector3,_float>.y = fStack_e4;
            wi_03.super_Tuple3<pbrt::Vector3,_float>.x = local_e8;
            wo_09.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_b8._0_4_;
            wi_03.super_Tuple3<pbrt::Vector3,_float>.z = local_48;
            fVar17 = ConductorBxDF::PDF((ConductorBxDF *)local_c0,wo_09,wi_03,mode,All);
          }
          else {
            wo_06.super_Tuple3<pbrt::Vector3,_float>.y = fStack_d4;
            wo_06.super_Tuple3<pbrt::Vector3,_float>.x = local_d8;
            wi_02.super_Tuple3<pbrt::Vector3,_float>.y = fStack_e4;
            wi_02.super_Tuple3<pbrt::Vector3,_float>.x = local_e8;
            wo_06.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_b8._0_4_;
            wi_02.super_Tuple3<pbrt::Vector3,_float>.z = local_48;
            fVar17 = DielectricInterfaceBxDF::PDF(&local_c8->top,wo_06,wi_02,mode,All);
          }
          local_fc = local_fc + fVar17;
          auVar30 = ZEXT1664(local_b8);
        }
        else {
          uVar12 = uVar12 >> 0xd ^ (uint)(uVar11 >> 0x1b);
          bVar9 = bVar9 >> 3;
          uVar11 = uVar11 * 0x5851f42d4c957f2d + lVar1;
          uVar13 = uVar11 * 0x5851f42d4c957f2d + lVar1;
          auVar7._4_12_ = in_register_00001384;
          auVar7._0_4_ = in_XMM6_Da;
          auVar16 = vcvtusi2ss_avx512f(auVar7,uVar12 >> bVar9 | uVar12 << 0x20 - bVar9);
          auVar16 = vminss_avx(ZEXT416((uint)(auVar16._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
          auVar20._8_8_ = 0;
          auVar20._0_8_ = uVar11;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = uVar13;
          auVar19 = vpunpcklqdq_avx(auVar20,auVar24);
          auVar15 = vpsrlvq_avx2(auVar19,_DAT_005c85b0);
          auVar18 = vpsrlvq_avx2(auVar19,_DAT_005c85c0);
          auVar15 = vpshufd_avx(auVar15 ^ auVar18,0xe8);
          auVar19 = vpsrlq_avx(auVar19,0x3b);
          auVar19 = vpshufd_avx(auVar19,0xe8);
          auVar15 = vprorvd_avx512vl(auVar15,auVar19);
          auVar15 = vcvtudq2ps_avx512vl(auVar15);
          auVar2._8_4_ = 0x2f800000;
          auVar2._0_8_ = 0x2f8000002f800000;
          auVar2._12_4_ = 0x2f800000;
          auVar15 = vmulps_avx512vl(auVar15,auVar2);
          auVar3._8_4_ = 0x3f7fffff;
          auVar3._0_8_ = 0x3f7fffff3f7fffff;
          auVar3._12_4_ = 0x3f7fffff;
          auVar15 = vminps_avx512vl(auVar15,auVar3);
          local_f8 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar15);
          if ((float)local_b8._0_4_ <= 0.0) {
            wo_10.super_Tuple3<pbrt::Vector3,_float>.y = fStack_e4;
            wo_10.super_Tuple3<pbrt::Vector3,_float>.x = local_e8;
            wo_10.super_Tuple3<pbrt::Vector3,_float>.z = local_48;
            ConductorBxDF::Sample_f
                      (&local_90,(ConductorBxDF *)local_c0,wo_10,auVar16._0_4_,(Point2f *)&local_f8,
                       local_ec,All);
          }
          else {
            wo_05.super_Tuple3<pbrt::Vector3,_float>.y = fStack_e4;
            wo_05.super_Tuple3<pbrt::Vector3,_float>.x = local_e8;
            wo_05.super_Tuple3<pbrt::Vector3,_float>.z = local_48;
            DielectricInterfaceBxDF::Sample_f
                      (&local_90,&local_c8->top,wo_05,auVar16._0_4_,(Point2f *)&local_f8,local_ec,
                       All);
          }
          auVar30 = ZEXT1664(local_b8);
          if ((0.0 < local_90.pdf) &&
             (((local_90.wi.super_Tuple3<pbrt::Vector3,_float>.z != 0.0 ||
               (NAN(local_90.wi.super_Tuple3<pbrt::Vector3,_float>.z))) &&
              (((undefined1)local_90.flags & Reflection) == Unset)))) {
            auVar22 = ZEXT1664(CONCAT412(0x80000000,
                                         CONCAT48(0x80000000,
                                                  local_6c.wi.super_Tuple3<pbrt::Vector3,_float>.
                                                  _0_8_ ^ 0x8000000080000000)));
            auVar30 = ZEXT1664(CONCAT412(0x80000000,
                                         CONCAT48(0x80000000,
                                                  CONCAT44(0x80000000,
                                                           local_6c.wi.
                                                           super_Tuple3<pbrt::Vector3,_float>.z) ^
                                                  0x80000000)));
            auVar27 = ZEXT1664(CONCAT412(0x80000000,
                                         CONCAT48(0x80000000,
                                                  CONCAT44(local_90.wi.
                                                           super_Tuple3<pbrt::Vector3,_float>.y,
                                                           local_90.wi.
                                                           super_Tuple3<pbrt::Vector3,_float>.x) ^
                                                  0x8000000080000000)));
            fVar28 = -local_90.wi.super_Tuple3<pbrt::Vector3,_float>.z;
            this_01 = local_a8;
            this_00 = local_a0;
            if (local_b8._0_4_ <= 0.0) goto LAB_003460d5;
            goto LAB_0034616b;
          }
LAB_003461b8:
          uVar11 = uVar13 * 0x5851f42d4c957f2d + lVar1;
        }
      }
      uVar12 = (int)pLVar14 + 1;
      pLVar14 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)(ulong)uVar12;
      bVar9 = (this->config).nSamples;
    } while (uVar12 < bVar9);
  }
  return (local_fc / (float)bVar9) * 0.9 + 0.007957749;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(Vector3f wo, Vector3f wi, TransportMode mode,
              BxDFReflTransFlags sampleFlags = BxDFReflTransFlags::All) const {
        CHECK(sampleFlags == BxDFReflTransFlags::All);  // for now
        // Set _wi_ and _wi_ for layered BSDF evaluation
        if (config.twoSided && wo.z < 0) {
            // BIG WIN
            wo = -wo;
            wi = -wi;
        }

        // Declare _RNG_ for layered BSDF evaluation
        RNG rng(Hash(GetOptions().seed, wo), Hash(wi));
        auto r = [&rng]() {
            return std::min<Float>(rng.Uniform<Float>(), OneMinusEpsilon);
        };

        bool enteredTop = wo.z > 0;
        Float pdfSum = 0;
        // Update _pdfSum_ for reflection at the entrance layer
        if (SameHemisphere(wo, wi)) {
            if (enteredTop)
                pdfSum += config.nSamples *
                          top.PDF(wo, wi, mode, BxDFReflTransFlags::Reflection);
            else
                pdfSum += config.nSamples *
                          bottom.PDF(wo, wi, mode, BxDFReflTransFlags::Reflection);
        }

        for (int s = 0; s < config.nSamples; ++s) {
            // Evaluate layered BSDF PDF sample
            if (SameHemisphere(wo, wi)) {
                // Evaluate TRT term for PDF estimate
                TopOrBottomBxDF<TopBxDF, BottomBxDF> rInterface, tInterface;
                if (enteredTop) {
                    rInterface = &bottom;
                    tInterface = &top;
                } else {
                    rInterface = &top;
                    tInterface = &bottom;
                }
                // Sample _tInterface_ to get direction into the layers
                Float uc = r();
                Point2f u(r(), r());
                BSDFSample wos = tInterface.Sample_f(wo, uc, u, mode);

                // Update _pdfSum_ accounting for TRT scattering events
                if (!wos || wos.wi.z == 0 || wos.IsReflection()) {
                    pdfSum += tInterface.PDF(wo, wi, mode);
                } else {
                    uc = r();
                    u = Point2f(r(), r());
                    BSDFSample wis = tInterface.Sample_f(wi, uc, u, ~mode);
                    if (!wis || wis.wi.z == 0 || wis.IsReflection())
                        continue;
                    // if (IsSpecular(tInterface.Flags()))
                    pdfSum += rInterface.PDF(-wos.wi, -wis.wi, mode);
                }

            } else {
                // Evaluate TT term for PDF estimate
                TopOrBottomBxDF<TopBxDF, BottomBxDF> toInterface, tiInterface;
                if (enteredTop) {
                    toInterface = &top;
                    tiInterface = &bottom;
                } else {
                    toInterface = &bottom;
                    tiInterface = &top;
                }

                Float uc = r();
                Point2f u(r(), r());
                BSDFSample wos = toInterface.Sample_f(wo, uc, u, mode);
                if (!wos || wos.wi.z == 0 || wos.IsReflection())
                    continue;

                uc = r();
                u = Point2f(r(), r());
                BSDFSample wis = tiInterface.Sample_f(wi, uc, u, ~mode);
                if (!wis || wis.wi.z == 0 || wis.IsReflection())
                    continue;

                if (IsSpecular(toInterface.Flags()))
                    pdfSum += tiInterface.PDF(-wos.wi, wi, mode);
                else if (IsSpecular(tiInterface.Flags()))
                    pdfSum += toInterface.PDF(wo, -wis.wi, mode);
                else
                    pdfSum += (toInterface.PDF(wo, -wis.wi, mode) +
                               tiInterface.PDF(-wos.wi, wi, mode)) /
                              2;
            }
        }
        // Return mixture of PDF estimate and constant PDF
        return Lerp(.9, 1 / (4 * Pi), pdfSum / config.nSamples);
    }